

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

ValueT * Qentem::JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::parseValue
                   (ValueT *__return_storage_ptr__,StringStream<char16_t> *stream,char16_t *content,
                   SizeT *offset,SizeT length)

{
  QNumber64 QVar1;
  QNumberType QVar2;
  ValueType VVar3;
  uint uVar4;
  SizeT SVar5;
  SizeT len;
  uint uVar6;
  char16_t *pcVar7;
  char16_t cVar8;
  JSONUtils *this;
  QNumber64 number;
  QNumber64 local_38;
  SizeT local_30;
  
  uVar4 = *offset;
  cVar8 = content[uVar4];
  if (cVar8 == L'\"') {
    uVar4 = uVar4 + 1;
    this = (JSONUtils *)(content + uVar4);
    *offset = uVar4;
    SVar5 = JSONUtils::UnEscape<char16_t,Qentem::StringStream<char16_t>>
                      (this,(char16_t *)(ulong)(length - uVar4),(SizeT)stream,
                       (StringStream<char16_t> *)(ulong)(ushort)cVar8);
    if (SVar5 != 0) {
      *offset = *offset + SVar5;
      len = stream->length_;
      if (len == 0) {
        len = SVar5 - 1;
      }
      else {
        this = (JSONUtils *)stream->storage_;
        stream->length_ = 0;
      }
      String<char16_t>::String((String<char16_t> *)&local_38,(char16_t *)this,len);
      SVar5 = local_30;
      QVar1 = local_38;
      local_30 = 0;
      local_38.Natural = 0;
      (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)QVar1;
      (__return_storage_ptr__->field_0).array_.index_ = SVar5;
      __return_storage_ptr__->type_ = String;
      Memory::Deallocate((void *)0x0);
      return __return_storage_ptr__;
    }
  }
  else {
    if (cVar8 == L'[') {
      *offset = uVar4 + 1;
      parseArray(__return_storage_ptr__,stream,content,offset,length);
      return __return_storage_ptr__;
    }
    if (cVar8 == L'f') {
      uVar4 = uVar4 + 1;
      pcVar7 = L"alse";
      uVar6 = uVar4;
      if (uVar4 < length) {
        uVar6 = length;
      }
      for (; uVar4 < length; uVar4 = uVar4 + 1) {
        cVar8 = *pcVar7;
        if (content[uVar4] != cVar8) {
          *offset = uVar4;
          goto LAB_0010c4eb;
        }
        pcVar7 = pcVar7 + 1;
      }
      *offset = uVar6;
      cVar8 = *pcVar7;
LAB_0010c4eb:
      if (cVar8 == L'\0') {
        (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
        *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
        __return_storage_ptr__->type_ = False;
        return __return_storage_ptr__;
      }
    }
    else {
      if (cVar8 == L'{') {
        *offset = uVar4 + 1;
        parseObject(__return_storage_ptr__,stream,content,offset,length);
        return __return_storage_ptr__;
      }
      if (cVar8 == L't') {
        uVar4 = uVar4 + 1;
        pcVar7 = L"rue";
        uVar6 = uVar4;
        if (uVar4 < length) {
          uVar6 = length;
        }
        for (; uVar4 < length; uVar4 = uVar4 + 1) {
          cVar8 = *pcVar7;
          if (content[uVar4] != cVar8) {
            *offset = uVar4;
            goto LAB_0010c504;
          }
          pcVar7 = pcVar7 + 1;
        }
        *offset = uVar6;
        cVar8 = *pcVar7;
LAB_0010c504:
        if (cVar8 == L'\0') {
          (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
          *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
          *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
          __return_storage_ptr__->type_ = True;
          return __return_storage_ptr__;
        }
      }
      else {
        if (cVar8 != L'n') {
          local_38.Natural = 0;
          QVar2 = Digit::stringToNumber<char16_t>(&local_38,content,offset,length);
          if (QVar2 == Real) {
            VVar3 = Double;
            (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_38;
          }
          else if (QVar2 == Integer) {
            (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_38;
            VVar3 = IntLong;
          }
          else {
            if (QVar2 != Natural) goto LAB_0010c51f;
            (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)local_38;
            VVar3 = UIntLong;
          }
          __return_storage_ptr__->type_ = VVar3;
          return __return_storage_ptr__;
        }
        uVar4 = uVar4 + 1;
        pcVar7 = L"ull";
        uVar6 = uVar4;
        if (uVar4 < length) {
          uVar6 = length;
        }
        for (; uVar4 < length; uVar4 = uVar4 + 1) {
          cVar8 = *pcVar7;
          if (content[uVar4] != cVar8) {
            *offset = uVar4;
            goto LAB_0010c51a;
          }
          pcVar7 = pcVar7 + 1;
        }
        *offset = uVar6;
        cVar8 = *pcVar7;
LAB_0010c51a:
        if (cVar8 == L'\0') {
          (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
          *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
          *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
          __return_storage_ptr__->type_ = Null;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_0010c51f:
  *offset = length;
  __return_storage_ptr__->type_ = Undefined;
  (__return_storage_ptr__->field_0).array_.storage_ = (Value<char16_t> *)0x0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseValue(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            switch (content[offset]) {
                case JSONotation::SCurlyChar: {
                    ++offset;
                    return parseObject(stream, content, offset, length);
                }

                case JSONotation::SSquareChar: {
                    ++offset;
                    return parseArray(stream, content, offset, length);
                }

                case JSONotation::QuoteChar: {
                    ++offset;

                    const Char_T *str = (content + offset);
                    SizeT         len = JSONUtils::UnEscape(str, (length - offset), stream);

                    if (len != 0) {
                        offset += len;
                        --len;

                        if (stream.IsNotEmpty()) {
                            str = stream.First();
                            len = stream.Length();
                            stream.Clear();
                        }

                        return ValueT{String<Char_T>{str, len}};
                    }

                    break;
                }

                case JSONotation::T_Char: {
                    const Char_T *true_string = (JSONotation::TrueString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *true_string)) {
                        ++true_string;
                        ++offset;
                    }

                    if (*true_string == Char_T{0}) {
                        return ValueT{ValueType::True};
                    }

                    break;
                }

                case JSONotation::F_Char: {
                    const Char_T *false_string = (JSONotation::FalseString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *false_string)) {
                        ++false_string;
                        ++offset;
                    }

                    if (*false_string == Char_T{0}) {
                        return ValueT{ValueType::False};
                    }

                    break;
                }

                case JSONotation::N_Char: {
                    const Char_T *null_string = (JSONotation::NullString + 1U);

                    ++offset;

                    while ((offset < length) && (content[offset] == *null_string)) {
                        ++null_string;
                        ++offset;
                    }

                    if (*null_string == Char_T{0}) {
                        return ValueT{ValueType::Null};
                    }

                    break;
                }

                default: {
                    QNumber64 number;

                    switch (Digit::StringToNumber(number, content, offset, length)) {
                        case QNumberType::Natural: {
                            return ValueT{number.Natural};
                        }

                        case QNumberType::Integer: {
                            return ValueT{number.Integer};
                        }

                        case QNumberType::Real: {
                            return ValueT{number.Real};
                        }

                        default: {
                        }
                    };
                }
            }

            offset = length;
            return ValueT{};
        }